

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O1

void __thiscall
helics::TranslatorFederate::TranslatorFederate
          (TranslatorFederate *this,GlobalFederateId fedID,string *name,GlobalBrokerId coreID,
          Core *param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TimeCoordinator *this_00;
  pointer pcVar3;
  undefined8 uVar4;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  (this->mFedID).gid = fedID.gid;
  (this->mCoreID).gid = coreID.gid;
  paVar1 = &(this->mName).field_2;
  (this->mName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mName).field_2 + 8) = uVar4;
  }
  else {
    (this->mName)._M_dataplus._M_p = pcVar3;
    (this->mName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->mName)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  this_00 = &this->mCoord;
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/TranslatorFederate.cpp:31:12)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/TranslatorFederate.cpp:31:12)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  TimeCoordinator::TimeCoordinator
            (this_00,(function<void_(const_helics::ActionMessage_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
  }
  this->mHandles = (HandleManager *)0x0;
  this->current_state = CREATED;
  this->usingGlobalTime = false;
  memset(&this->mQueueMessage,0,0xe0);
  (this->minReturnTime).internalTimeCode = 0x7fffffffffffffff;
  (this->translators).dataStorage.
  super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->translators).dataStorage.
  super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->translators).dataStorage.
  super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->translators).lookup._M_h._M_buckets = &(this->translators).lookup._M_h._M_single_bucket;
  (this->translators).lookup._M_h._M_bucket_count = 1;
  (this->translators).lookup._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->translators).lookup._M_h._M_element_count = 0;
  (this->translators).lookup._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->translators).lookup._M_h._M_rehash_policy._M_next_resize = 0;
  (this->translators).lookup._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mCoord).super_BaseTimeCoordinator.mSourceId.gid = fedID.gid;
  TimeCoordinator::setOptionFlag(this_00,0x51,true);
  (this->mCoord).super_BaseTimeCoordinator.nonGranting = true;
  TimeCoordinator::setProperty(this_00,0x96,(Time)0x1);
  return;
}

Assistant:

TranslatorFederate::TranslatorFederate(GlobalFederateId fedID,
                                       std::string name,
                                       GlobalBrokerId coreID,
                                       Core* /*core*/):
    mFedID(fedID), mCoreID(coreID), mName(std::move(name)), /*mCore(core),*/
    mCoord([this](const ActionMessage& msg) { routeMessage(msg); })
{
    mCoord.setSourceId(fedID);
    mCoord.setOptionFlag(helics::defs::Flags::EVENT_TRIGGERED, true);
    mCoord.specifyNonGranting(true);
    mCoord.setProperty(HELICS_PROPERTY_TIME_OUTPUT_DELAY, Time::epsilon());
}